

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *local_48;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if ((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar2 = GetFrontMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if ((((local_10->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           ((local_10->HoveredRootWindow->Flags & 1U) == 0)) {
          _modal = ImGuiWindow::TitleBarRect(local_10->HoveredRootWindow);
          bVar1 = ImRect::Contains((ImRect *)&modal,(local_10->IO).MouseClickedPos);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_10->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if (((local_10->IO).MouseClicked[1] & 1U) != 0) {
      local_48 = GetFrontMostPopupModal();
      bVar1 = local_48 == (ImGuiWindow *)0x0;
      window._0_4_ = (local_10->Windows).Size;
      while (window._0_4_ = (int)window + -1, -1 < (int)window && !bVar1) {
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window);
        if (*ppIVar3 == local_48) break;
        if (*ppIVar3 == local_10->HoveredWindow) {
          bVar1 = true;
        }
      }
      if (bVar1) {
        local_48 = local_10->HoveredWindow;
      }
      ClosePopupsOverWindow(local_48,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    // Initiate moving window
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the front most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetFrontMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}